

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learn.cpp
# Opt level: O1

void readfile(char *data_file)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  iterator iVar7;
  vector<double,_std::allocator<double>_> *pvVar8;
  long lVar9;
  char buff [200000];
  vector<double,_std::allocator<double>_> vStack_30da8;
  int iStack_30d84;
  FILE *pFStack_30d80;
  char acStack_30d78 [200008];
  
  pFStack_30d80 = fopen(data_file,"r");
  if (0 < data_n) {
    iVar6 = 0;
    do {
      vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
      ::emplace_back<std::vector<double,std::allocator<double>>>
                ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                  *)&data_x,&vStack_30da8);
      if (vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
      ::emplace_back<std::vector<double,std::allocator<double>>>
                ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                  *)&data_y,&vStack_30da8);
      if (vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < data_n);
  }
  uVar4 = 0xffffffffffffffff;
  if (-1 < data_n) {
    uVar4 = (long)data_n * 4;
  }
  pvVar2 = operator_new__(uVar4);
  iVar6 = 200000;
  if (0 < data_n) {
    lVar9 = 0;
    do {
      fgets(acStack_30d78,200000,pFStack_30d80);
      pcVar3 = strtok(acStack_30d78,", \r\n");
      iVar1 = atoi(pcVar3);
      *(int *)((long)pvVar2 + lVar9 * 4) = iVar1;
      iStack_30d84 = iVar6;
      if (iVar1 < iVar6) {
        iStack_30d84 = iVar1;
      }
      pcVar3 = strtok((char *)0x0,", \r\n");
      if (0 < ts_len) {
        iVar6 = 0;
        do {
          pvVar8 = data_x.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar9;
          vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)atof(pcVar3);
          iVar7._M_current =
               (pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar7._M_current ==
              (pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (pvVar8,iVar7,(double *)&vStack_30da8);
          }
          else {
            *iVar7._M_current =
                 (double)vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
            (pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar7._M_current + 1;
          }
          pcVar3 = strtok((char *)0x0,", \r\n");
          iVar6 = iVar6 + 1;
        } while (iVar6 < ts_len);
      }
      lVar9 = lVar9 + 1;
      iVar6 = iStack_30d84;
    } while (lVar9 < data_n);
  }
  num_c = 0;
  if (0 < data_n) {
    uVar4 = (ulong)(uint)data_n;
    uVar5 = 0;
    num_c = 0;
    do {
      iVar1 = *(int *)((long)pvVar2 + uVar5 * 4) - iVar6;
      *(int *)((long)pvVar2 + uVar5 * 4) = iVar1;
      if (iVar1 < num_c) {
        iVar1 = num_c;
      }
      num_c = iVar1;
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  num_c = num_c + 1;
  if (0 < data_n) {
    lVar9 = 0;
    do {
      if (0 < num_c) {
        iVar6 = 0;
        do {
          pvVar8 = data_y.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar9;
          if (iVar6 == *(int *)((long)pvVar2 + lVar9 * 4)) {
            vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
            iVar7._M_current =
                 (pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar7._M_current ==
                (pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) goto LAB_00101a31;
            *iVar7._M_current = 1.0;
LAB_00101a27:
            (pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar7._M_current + 1;
          }
          else {
            vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            iVar7._M_current =
                 (pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar7._M_current !=
                (pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *iVar7._M_current = 0.0;
              goto LAB_00101a27;
            }
LAB_00101a31:
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (pvVar8,iVar7,(double *)&vStack_30da8);
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 < num_c);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < data_n);
  }
  operator_delete__(pvVar2);
  fclose(pFStack_30d80);
  return;
}

Assistant:

void readfile(char *data_file) {
    FILE *f;
    f = fopen(data_file, "r");

    char buff[MAX_CHAR_PER_LINE];
    char *tmp;

    for (int i = 0; i < data_n; ++i) {
        data_x.push_back(vector<double>());
        data_y.push_back(vector<double>());
    }

    int *label = new int[data_n];
    int min_c = MAX_CHAR_PER_LINE;

    for (int i = 0; i < data_n; i++) {
        fgets(buff, MAX_CHAR_PER_LINE, f);
        tmp = strtok(buff, ", \r\n");

        label[i] = atoi(tmp);
        min_c = min(min_c, label[i]);

        tmp = strtok(NULL, ", \r\n");
        for (int j = 0; j < ts_len; ++j) {
            data_x[i].push_back(atof(tmp));
            tmp = strtok(NULL, ", \r\n");
        }
    }

    num_c = 0;
    for (int i = 0; i < data_n; ++i) {
        label[i] -= min_c;
        num_c = max(num_c, label[i]);
    }
    ++num_c;

    /**
     * label(xi) = a => y = {0 .... 1 .... 0}
     *                              ^
     *                              a position
     */
    for (int i = 0; i < data_n; ++i) {
        for (int j = 0; j < num_c; ++j) {
            if (j == label[i]) {
                data_y[i].push_back(1.0);
            } else {
                data_y[i].push_back(0.0);
            }
        }
    }

    delete[] label;

    fclose(f);
}